

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
GraphBuilder::getCorrespondingForks
          (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,GraphBuilder *this,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __hash_code __code;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> forks;
  CallInst *local_58;
  _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
  local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar2 = (this->llvmToJoins_)._M_h._M_bucket_count;
  uVar5 = (ulong)callInst % uVar2;
  p_Var3 = (this->llvmToJoins_)._M_h._M_buckets[uVar5];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var3->_M_nxt, p_Var6 = p_Var3, (CallInst *)p_Var7[1]._M_nxt != callInst)) {
    while (p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var6 = p_Var7, p_Var7 = p_Var4, (CallInst *)p_Var4[1]._M_nxt == callInst))
      goto LAB_00119b4a;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00119b4a:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    JoinNode::correspondingForks
              ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)&local_50,
               (JoinNode *)p_Var4[2]._M_nxt);
    for (; (_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_50._M_impl.super__Rb_tree_header;
        local_50._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment(local_50._M_impl.super__Rb_tree_header._M_header._M_left)) {
      local_58 = Node::callInstruction
                           (*(Node **)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1)
                           );
      std::
      _Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
      ::_M_insert_unique<llvm::CallInst_const*>
                ((_Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
                  *)__return_storage_ptr__,&local_58);
    }
    std::
    _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
    ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const CallInst *>
GraphBuilder::getCorrespondingForks(const CallInst *callInst) const {
    std::set<const CallInst *> llvmForks;
    auto iterator = llvmToJoins_.find(callInst);
    if (iterator != llvmToJoins_.end()) {
        auto forks = iterator->second->correspondingForks();
        for (auto *fork : forks) {
            llvmForks.insert(fork->callInstruction());
        }
    }
    return llvmForks;
}